

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_combo_begin_symbol_text
              (nk_context *ctx,char *selected,int len,nk_symbol_type symbol,nk_vec2 size)

{
  long lVar1;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect header_00;
  nk_rect r_00;
  nk_vec2 size_00;
  nk_rect b;
  nk_rect content_00;
  nk_widget_layout_states nVar2;
  int iVar3;
  int *piVar4;
  long in_RDI;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float a;
  float fVar9;
  float fVar10;
  float len_00;
  nk_symbol_type sym;
  nk_rect image;
  nk_rect label;
  nk_rect button;
  nk_rect content;
  nk_text text;
  nk_color symbol_color;
  nk_style_item *background;
  nk_widget_layout_states s;
  int is_clicked;
  nk_rect header;
  nk_input *in;
  nk_style *style;
  nk_window *win;
  long local_190;
  nk_context *in_stack_fffffffffffffe80;
  nk_command_buffer *in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  nk_color c;
  undefined4 in_stack_fffffffffffffe98;
  nk_symbol_type in_stack_fffffffffffffe9c;
  nk_style_button *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  nk_flags state;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  nk_rect *in_stack_fffffffffffffeb8;
  nk_window *win_00;
  nk_input *in_stack_fffffffffffffec0;
  nk_context *ctx_00;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  float in_stack_fffffffffffffee0;
  float fVar12;
  float fVar13;
  nk_color local_70;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar14;
  int iVar15;
  nk_color in_stack_ffffffffffffffb0;
  nk_color in_stack_ffffffffffffffb4;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  int local_4;
  
  state = (nk_flags)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  c = SUB84((ulong)in_stack_fffffffffffffe90 >> 0x20,0);
  iVar15 = 0;
  if (((in_RDI == 0) || (*(long *)(in_RDI + 0x3fc8) == 0)) ||
     (*(long *)(*(long *)(in_RDI + 0x3fc8) + 0xa0) == 0)) {
    local_4 = 0;
  }
  else {
    lVar1 = *(long *)(in_RDI + 0x3fc8);
    nVar2 = nk_widget((nk_rect *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    if (nVar2 == NK_WIDGET_INVALID) {
      local_4 = 0;
    }
    else {
      if (((*(uint *)(*(long *)(lVar1 + 0xa0) + 4) & 0x800) != 0) ||
         (local_190 = in_RDI, nVar2 == NK_WIDGET_ROM)) {
        local_190 = 0;
      }
      r_00.y = (float)in_stack_fffffffffffffed8;
      r_00.x = (float)in_stack_fffffffffffffed4;
      r_00.w = (float)in_stack_fffffffffffffedc;
      r_00.h = in_stack_fffffffffffffee0;
      iVar3 = nk_button_behavior((nk_flags *)
                                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),r_00,
                                 in_stack_fffffffffffffec0,
                                 (nk_button_behavior)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      if (iVar3 != 0) {
        iVar15 = 1;
      }
      if ((*(uint *)(in_RDI + 0x1f50) & 0x20) == 0) {
        if ((*(uint *)(in_RDI + 0x1f50) & 0x10) == 0) {
          piVar4 = (int *)(in_RDI + 0x1a98);
          uVar14 = *(undefined4 *)(in_RDI + 0x1b08);
        }
        else {
          piVar4 = (int *)(in_RDI + 0x1ab8);
          uVar14 = *(undefined4 *)(in_RDI + 0x1b0c);
        }
      }
      else {
        piVar4 = (int *)(in_RDI + 0x1ad8);
        uVar14 = *(undefined4 *)(in_RDI + 0x1b10);
      }
      if (*piVar4 == 1) {
        local_70 = nk_rgba(0,0,0,0);
        r.y = (float)in_stack_fffffffffffffe9c;
        r.x = (float)in_stack_fffffffffffffe98;
        r._8_8_ = in_stack_fffffffffffffea0;
        nk_draw_image(in_stack_fffffffffffffe88,r,(nk_image *)in_stack_fffffffffffffe80,c);
      }
      else {
        local_70 = *(nk_color *)(piVar4 + 2);
        rect.y = (float)in_stack_fffffffffffffe9c;
        rect.x = (float)in_stack_fffffffffffffe98;
        rect._8_8_ = in_stack_fffffffffffffea0;
        nk_fill_rect(in_stack_fffffffffffffe88,rect,
                     (float)((ulong)in_stack_fffffffffffffe80 >> 0x20),c);
        rect_00.y = (float)in_stack_fffffffffffffe9c;
        rect_00.x = (float)in_stack_fffffffffffffe98;
        rect_00._8_8_ = in_stack_fffffffffffffea0;
        nk_stroke_rect(in_stack_fffffffffffffe88,rect_00,
                       (float)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                       SUB84(in_stack_fffffffffffffe80,0),c);
      }
      if ((*(uint *)(in_RDI + 0x1f50) & 0x10) == 0) {
        if (iVar15 == 0) {
          uVar11 = *(undefined4 *)(in_RDI + 0x1bc8);
        }
        else {
          uVar11 = *(undefined4 *)(in_RDI + 0x1bd0);
        }
      }
      else {
        uVar11 = *(undefined4 *)(in_RDI + 0x1bcc);
      }
      fVar5 = in_stack_ffffffffffffffbc -
              (*(float *)(in_RDI + 0x1be8) + *(float *)(in_RDI + 0x1be8));
      fVar6 = (((float)in_stack_ffffffffffffffb0 + in_stack_ffffffffffffffb8) -
              in_stack_ffffffffffffffbc) - *(float *)(in_RDI + 0x1be4);
      fVar7 = (float)in_stack_ffffffffffffffb4 + *(float *)(in_RDI + 0x1be8);
      fVar8 = fVar6 + *(float *)(in_RDI + 0x1b98);
      fVar13 = fVar5;
      nk_draw_button_symbol
                ((nk_command_buffer *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                 (nk_rect *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),state,
                 in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                 (nk_user_font *)CONCAT44(in_stack_fffffffffffffed4,uVar11));
      a = (float)in_stack_ffffffffffffffb0 + *(float *)(in_RDI + 0x1bdc);
      fVar9 = (float)in_stack_ffffffffffffffb4 + *(float *)(in_RDI + 0x1be0);
      fVar10 = in_stack_ffffffffffffffbc -
               (*(float *)(in_RDI + 0x1be0) + *(float *)(in_RDI + 0x1be0));
      win_00 = (nk_window *)CONCAT44(fVar9,a);
      ctx_00 = (nk_context *)CONCAT44(fVar10,fVar10);
      content_00.y = in_stack_ffffffffffffffbc;
      content_00.x = in_stack_ffffffffffffffb8;
      content_00.w = (float)(int)local_190;
      content_00.h = (float)(int)((ulong)local_190 >> 0x20);
      fVar12 = fVar10;
      nk_draw_symbol((nk_command_buffer *)CONCAT44(iVar15,nVar2),
                     (nk_symbol_type)((ulong)piVar4 >> 0x20),content_00,in_stack_ffffffffffffffb4,
                     in_stack_ffffffffffffffb0,SUB84(piVar4,0),
                     (nk_user_font *)CONCAT44(uVar14,in_stack_ffffffffffffff98));
      nk_vec2(0.0,0.0);
      len_00 = a + fVar10 + *(float *)(in_RDI + 0x1bec) + *(float *)(in_RDI + 0x1bdc);
      b.y = fVar5;
      b.x = fVar7;
      b.w = fVar13;
      b.h = fVar8;
      nk_widget_text((nk_command_buffer *)
                     CONCAT44(fVar6,in_stack_ffffffffffffffbc -
                                    (*(float *)(in_RDI + 0x1be0) + *(float *)(in_RDI + 0x1be0))),b,
                     (char *)CONCAT44((fVar6 - *(float *)(in_RDI + 0x1bdc)) - len_00,
                                      (float)in_stack_ffffffffffffffb4 + *(float *)(in_RDI + 0x1be0)
                                     ),(int)len_00,(nk_text *)CONCAT44(fVar10,fVar9),(nk_flags)a,
                     (nk_user_font *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      size_00.y = fVar12;
      size_00.x = fVar10;
      header_00.y = (float)uVar11;
      header_00.x = (float)in_stack_fffffffffffffecc;
      header_00.w = a;
      header_00.h = fVar9;
      local_4 = nk_combo_begin(ctx_00,win_00,size_00,(int)local_70,header_00);
    }
  }
  return local_4;
}

Assistant:

NK_API int
nk_combo_begin_symbol_text(struct nk_context *ctx, const char *selected, int len,
    enum nk_symbol_type symbol, struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_style *style;
    struct nk_input *in;

    struct nk_rect header;
    int is_clicked = nk_false;
    enum nk_widget_layout_states s;
    const struct nk_style_item *background;
    struct nk_color symbol_color;
    struct nk_text text;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (!s) return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->combo.active;
        symbol_color = style->combo.symbol_active;
        text.text = style->combo.label_active;
    } else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
        background = &style->combo.hover;
        symbol_color = style->combo.symbol_hover;
        text.text = style->combo.label_hover;
    } else {
        background = &style->combo.normal;
        symbol_color = style->combo.symbol_normal;
        text.text = style->combo.label_normal;
    }
    if (background->type == NK_STYLE_ITEM_IMAGE) {
        text.background = nk_rgba(0,0,0,0);
        nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
    } else {
        text.background = background->data.color;
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        struct nk_rect content;
        struct nk_rect button;
        struct nk_rect label;
        struct nk_rect image;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;
        nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);

        /* draw symbol */
        image.x = header.x + style->combo.content_padding.x;
        image.y = header.y + style->combo.content_padding.y;
        image.h = header.h - 2 * style->combo.content_padding.y;
        image.w = image.h;
        nk_draw_symbol(&win->buffer, symbol, image, text.background, symbol_color,
            1.0f, style->font);

        /* draw label */
        text.padding = nk_vec2(0,0);
        label.x = image.x + image.w + style->combo.spacing.x + style->combo.content_padding.x;
        label.y = header.y + style->combo.content_padding.y;
        label.w = (button.x - style->combo.content_padding.x) - label.x;
        label.h = header.h - 2 * style->combo.content_padding.y;
        nk_widget_text(&win->buffer, label, selected, len, &text, NK_TEXT_LEFT, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}